

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

bool __thiscall dg::llvmdg::LLVMSlicer::removeNode(LLVMSlicer *this,LLVMNode *node)

{
  Value *this_00;
  Type *pTVar1;
  ret_type pIVar2;
  ret_type pGVar3;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RSI;
  GlobalVariable *GV;
  Instruction *Inst;
  Value *val;
  Value *in_stack_ffffffffffffffd0;
  
  this_00 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey(in_RSI);
  pTVar1 = llvm::Value::getType(this_00);
  llvm::UndefValue::get(pTVar1);
  llvm::Value::replaceAllUsesWith(this_00);
  pIVar2 = llvm::dyn_cast<llvm::Instruction,llvm::Value>(in_stack_ffffffffffffffd0);
  if (pIVar2 == (ret_type)0x0) {
    pGVar3 = llvm::dyn_cast<llvm::GlobalVariable,llvm::Value>(in_stack_ffffffffffffffd0);
    if (pGVar3 != (ret_type)0x0) {
      llvm::GlobalVariable::eraseFromParent();
    }
  }
  else {
    llvm::Instruction::eraseFromParent();
  }
  return true;
}

Assistant:

bool removeNode(LLVMNode *node) override {
        using namespace llvm;

        Value *val = node->getKey();
        // if there are any other uses of this value,
        // just replace them with undef
        val->replaceAllUsesWith(UndefValue::get(val->getType()));

        Instruction *Inst = dyn_cast<Instruction>(val);
        if (Inst) {
            Inst->eraseFromParent();
        } else {
            GlobalVariable *GV = dyn_cast<GlobalVariable>(val);
            if (GV)
                GV->eraseFromParent();
        }

        return true;
    }